

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O0

X509 * x509_parse(CBS *cbs,CRYPTO_BUFFER *buf)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  X509 *__p;
  pointer pxVar5;
  uint8_t *puVar6;
  X509_ALGOR *pXVar7;
  ASN1_BIT_STRING *pAVar8;
  long local_98;
  long version;
  uint8_t *inp;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_80;
  UniquePtr<X509> ret;
  size_t sStack_70;
  int indefinite;
  size_t header_len;
  undefined1 local_60 [4];
  CBS_ASN1_TAG tag;
  CBS sig;
  CBS sigalg;
  CBS tbs;
  CBS cert;
  CRYPTO_BUFFER *buf_local;
  CBS *cbs_local;
  
  iVar3 = CBS_get_asn1(cbs,(CBS *)&tbs.len,0x20000010);
  if ((((iVar3 == 0) || (sVar4 = CBS_len((CBS *)&tbs.len), 0x3fffffff < sVar4)) ||
      (iVar3 = CBS_get_asn1_element((CBS *)&tbs.len,(CBS *)&sigalg.len,0x20000010), iVar3 == 0)) ||
     (iVar3 = CBS_get_asn1_element((CBS *)&tbs.len,(CBS *)&sig.len,0x20000010), iVar3 == 0)) {
    ERR_put_error(0xc,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,0x70);
    return (X509 *)(CBS *)0x0;
  }
  iVar3 = CBS_get_any_ber_asn1_element
                    ((CBS *)&tbs.len,(CBS *)local_60,(CBS_ASN1_TAG *)((long)&header_len + 4),
                     &stack0xffffffffffffff90,(int *)0x0,
                     (int *)((long)&ret._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                    ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 4));
  if (((iVar3 == 0) || (header_len._4_4_ != 3)) ||
     ((ret._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._4_4_ != 0 ||
      ((iVar3 = CBS_skip((CBS *)local_60,sStack_70), iVar3 == 0 ||
       (sVar4 = CBS_len((CBS *)&tbs.len), sVar4 != 0)))))) {
    ERR_put_error(0xc,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                  ,0x82);
    return (X509 *)(CBS *)0x0;
  }
  __p = x509_new_null();
  std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<x509_st,bssl::internal::Deleter> *)&local_80,__p);
  bVar2 = std::operator==(&local_80,(nullptr_t)0x0);
  if (bVar2) {
    cbs_local = (CBS *)0x0;
  }
  else {
    version = (long)CBS_data((CBS *)&sigalg.len);
    pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->(&local_80);
    sVar4 = CBS_len((CBS *)&sigalg.len);
    iVar3 = ASN1_item_ex_d2i((ASN1_VALUE **)pxVar5,(uchar **)&version,sVar4,
                             (ASN1_ITEM *)&X509_CINF_it,-1,0,'\0',(ASN1_TLC *)buf);
    lVar1 = version;
    if (0 < iVar3) {
      puVar6 = CBS_data((CBS *)&sigalg.len);
      sVar4 = CBS_len((CBS *)&sigalg.len);
      if ((uint8_t *)lVar1 == puVar6 + sVar4) {
        version = (long)CBS_data((CBS *)&sig.len);
        sVar4 = CBS_len((CBS *)&sig.len);
        pXVar7 = d2i_X509_ALGOR((X509_ALGOR **)0x0,(uchar **)&version,sVar4);
        pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->(&local_80);
        pxVar5->sig_alg = (X509_ALGOR *)pXVar7;
        pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->(&local_80);
        lVar1 = version;
        if (pxVar5->sig_alg != (X509_ALGOR *)0x0) {
          puVar6 = CBS_data((CBS *)&sig.len);
          sVar4 = CBS_len((CBS *)&sig.len);
          if ((uint8_t *)lVar1 == puVar6 + sVar4) {
            version = (long)CBS_data((CBS *)local_60);
            sVar4 = CBS_len((CBS *)local_60);
            pAVar8 = c2i_ASN1_BIT_STRING((ASN1_BIT_STRING **)0x0,(uchar **)&version,sVar4);
            pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->(&local_80);
            pxVar5->signature = (ASN1_BIT_STRING *)pAVar8;
            pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->(&local_80);
            lVar1 = version;
            if (pxVar5->signature != (ASN1_BIT_STRING *)0x0) {
              puVar6 = CBS_data((CBS *)local_60);
              sVar4 = CBS_len((CBS *)local_60);
              if ((uint8_t *)lVar1 == puVar6 + sVar4) {
                local_98 = 0;
                pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->(&local_80);
                if (pxVar5->cert_info->version != (ASN1_INTEGER *)0x0) {
                  pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->(&local_80);
                  local_98 = ASN1_INTEGER_get((ASN1_INTEGER *)pxVar5->cert_info->version);
                  if ((local_98 < 0) || (2 < local_98)) {
                    ERR_put_error(0xb,0,0x8c,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                                  ,0xaa);
                    cbs_local = (CBS *)0x0;
                    goto LAB_00239cf4;
                  }
                }
                if ((local_98 == 0) &&
                   ((pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                                        (&local_80),
                    pxVar5->cert_info->issuerUID != (ASN1_BIT_STRING *)0x0 ||
                    (pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                                        (&local_80),
                    pxVar5->cert_info->subjectUID != (ASN1_BIT_STRING *)0x0)))) {
                  ERR_put_error(0xb,0,0x8b,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                                ,0xb2);
                  cbs_local = (CBS *)0x0;
                }
                else if ((local_98 == 2) ||
                        (pxVar5 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                                            (&local_80),
                        pxVar5->cert_info->extensions == (stack_st_X509_EXTENSION *)0x0)) {
                  cbs_local = (CBS *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::release
                                               (&local_80);
                }
                else {
                  ERR_put_error(0xb,0,0x8b,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_x509.cc"
                                ,0xb8);
                  cbs_local = (CBS *)0x0;
                }
                goto LAB_00239cf4;
              }
            }
            cbs_local = (CBS *)0x0;
            goto LAB_00239cf4;
          }
        }
        cbs_local = (CBS *)0x0;
        goto LAB_00239cf4;
      }
    }
    cbs_local = (CBS *)0x0;
  }
LAB_00239cf4:
  inp._4_4_ = 1;
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_80);
  return (X509 *)cbs_local;
}

Assistant:

static X509 *x509_parse(CBS *cbs, CRYPTO_BUFFER *buf) {
  CBS cert, tbs, sigalg, sig;
  if (!CBS_get_asn1(cbs, &cert, CBS_ASN1_SEQUENCE) ||
      // Bound the length to comfortably fit in an int. Lengths in this
      // module often omit overflow checks.
      CBS_len(&cert) > INT_MAX / 2 ||
      !CBS_get_asn1_element(&cert, &tbs, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_element(&cert, &sigalg, CBS_ASN1_SEQUENCE)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return nullptr;
  }

  // For just the signature field, we accept non-minimal BER lengths, though not
  // indefinite-length encoding. See b/18228011.
  //
  // TODO(crbug.com/boringssl/354): Switch the affected callers to convert the
  // certificate before parsing and then remove this workaround.
  CBS_ASN1_TAG tag;
  size_t header_len;
  int indefinite;
  if (!CBS_get_any_ber_asn1_element(&cert, &sig, &tag, &header_len,
                                    /*out_ber_found=*/nullptr,
                                    &indefinite) ||
      tag != CBS_ASN1_BITSTRING || indefinite ||  //
      !CBS_skip(&sig, header_len) ||              //
      CBS_len(&cert) != 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return nullptr;
  }

  bssl::UniquePtr<X509> ret(x509_new_null());
  if (ret == nullptr) {
    return nullptr;
  }

  // TODO(crbug.com/boringssl/443): When the rest of the library is decoupled
  // from the tasn_*.c implementation, replace this with |CBS|-based
  // functions.
  const uint8_t *inp = CBS_data(&tbs);
  if (ASN1_item_ex_d2i((ASN1_VALUE **)&ret->cert_info, &inp, CBS_len(&tbs),
                       ASN1_ITEM_rptr(X509_CINF), /*tag=*/-1,
                       /*aclass=*/0, /*opt=*/0, buf) <= 0 ||
      inp != CBS_data(&tbs) + CBS_len(&tbs)) {
    return nullptr;
  }

  inp = CBS_data(&sigalg);
  ret->sig_alg = d2i_X509_ALGOR(nullptr, &inp, CBS_len(&sigalg));
  if (ret->sig_alg == nullptr || inp != CBS_data(&sigalg) + CBS_len(&sigalg)) {
    return nullptr;
  }

  inp = CBS_data(&sig);
  ret->signature = c2i_ASN1_BIT_STRING(nullptr, &inp, CBS_len(&sig));
  if (ret->signature == nullptr || inp != CBS_data(&sig) + CBS_len(&sig)) {
    return nullptr;
  }

  // The version must be one of v1(0), v2(1), or v3(2).
  long version = X509_VERSION_1;
  if (ret->cert_info->version != nullptr) {
    version = ASN1_INTEGER_get(ret->cert_info->version);
    // TODO(https://crbug.com/boringssl/364): |X509_VERSION_1| should
    // also be rejected here. This means an explicitly-encoded X.509v1
    // version. v1 is DEFAULT, so DER requires it be omitted.
    if (version < X509_VERSION_1 || version > X509_VERSION_3) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
      return nullptr;
    }
  }

  // Per RFC 5280, section 4.1.2.8, these fields require v2 or v3.
  if (version == X509_VERSION_1 && (ret->cert_info->issuerUID != nullptr ||
                                    ret->cert_info->subjectUID != nullptr)) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_FOR_VERSION);
    return nullptr;
  }

  // Per RFC 5280, section 4.1.2.9, extensions require v3.
  if (version != X509_VERSION_3 && ret->cert_info->extensions != nullptr) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_FOR_VERSION);
    return nullptr;
  }

  return ret.release();
}